

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridtestExternalTests.cpp
# Opt level: O0

bool __thiscall
ExternalTester::testAnisotropicRefinement
          (ExternalTester *this,BaseFunction *f,TasmanianSparseGrid *grid,TypeDepth type,
          int min_growth,int *np,double *errs,int max_iter)

{
  bool bVar1;
  _Setw _Var2;
  ostream *poVar3;
  void *pvVar4;
  int *piVar5;
  TestResults TVar6;
  vector<double,_std::allocator<double>_> local_68;
  double local_50;
  TestResults R;
  int itr;
  int *np_local;
  int min_growth_local;
  TypeDepth type_local;
  TasmanianSparseGrid *grid_local;
  BaseFunction *f_local;
  ExternalTester *this_local;
  
  R._12_4_ = 0;
  while( true ) {
    if (max_iter <= (int)R._12_4_) {
      return true;
    }
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<double,_std::allocator<double>_>::vector(&local_68);
    TVar6 = getError(this,f,grid,type_internal_interpolation,&local_68);
    R.error._0_4_ = TVar6.num_points;
    local_50 = TVar6.error;
    std::vector<double,_std::allocator<double>_>::~vector(&local_68);
    if ((R.error._0_4_ != np[(int)R._12_4_]) ||
       (errs[(int)R._12_4_] <= local_50 && local_50 != errs[(int)R._12_4_])) break;
    bVar1 = TasGrid::TasmanianSparseGrid::isGlobal(grid);
    piVar5 = (int *)0xffffffff;
    if (bVar1) {
      piVar5 = (int *)0x0;
    }
    TasGrid::TasmanianSparseGrid::setAnisotropicRefinement((TypeDepth)grid,type,min_growth,piVar5);
    R._12_4_ = R._12_4_ + 1;
  }
  _Var2 = std::setw(0x12);
  poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
  poVar3 = std::operator<<(poVar3,"ERROR: FAILED refinement test at iteration: ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,R._12_4_);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<((ostream *)&std::cout," expected: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,np[(int)R._12_4_]);
  poVar3 = std::operator<<(poVar3,"  ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,errs[(int)R._12_4_]);
  poVar3 = std::operator<<(poVar3,"   computed: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,R.error._0_4_);
  poVar3 = std::operator<<(poVar3,"  ");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,local_50);
  std::ostream::operator<<(pvVar4,std::endl<char,std::char_traits<char>>);
  return false;
}

Assistant:

bool ExternalTester::testAnisotropicRefinement(const BaseFunction *f, TasmanianSparseGrid &grid, TypeDepth type, int min_growth, const int np[], const double errs[], int max_iter ) const{
    for(int itr=0; itr<max_iter; itr++){
        TestResults R = getError(f, grid, type_internal_interpolation);
        if ( (R.num_points != np[itr]) || (R.error > errs[itr]) ){
            cout << setw(18) << "ERROR: FAILED refinement test at iteration: " << itr << endl;
            cout << " expected: " << np[itr] << "  " << errs[itr] << "   computed: " << R.num_points << "  " << R.error << endl;
            return false;
        }
        grid.setAnisotropicRefinement(type, min_growth, (grid.isGlobal()) ? 0 : -1);
    }
    return true;
}